

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

bool __thiscall
ExecutorRegVm::ExecCall
          (ExecutorRegVm *this,uint microcodePos,uint functionId,RegVmCmd *instruction,
          RegVmRegister *regFilePtr)

{
  uint *puVar1;
  FastVector<RegVmCmd_*,_false,_false> *this_00;
  FastVector<char,_true,_true> *this_01;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *regFilePtr_00;
  uint uVar6;
  RegVmReturnType RVar7;
  RegVmReturnType RVar8;
  ExternFuncInfo *pEVar9;
  anon_union_8_3_3250f155_for_RegVmRegister_0 aVar10;
  uint uVar11;
  uint *puVar12;
  uint *puVar13;
  char *error;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *paVar14;
  RegVmCmd *local_38;
  
  paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase;
  pEVar9 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,functionId);
  puVar12 = (this->exLinker->exRegVmConstants).data + microcodePos;
LAB_0013d203:
  puVar13 = puVar12 + 2;
switchD_0013d21c_default:
  puVar12 = puVar13;
  puVar13 = puVar12 + 1;
  switch(puVar12[-2]) {
  case 1:
    bVar2 = (byte)puVar12[-1];
    RVar7 = (RegVmReturnType)(byte)*puVar12;
    uVar6 = pEVar9->regVmAddress;
    this_00 = &this->callStack;
    local_38 = instruction + 1;
    if ((ulong)uVar6 == 0xffffffff) {
      FastVector<RegVmCmd_*,_false,_false>::push_back(this_00,&local_38);
      paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                ((long)paVar14 - (ulong)(pEVar9->argumentSize & 0xfffffffc));
      if (paVar14 != (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase) {
        __assert_fail("tempStackPtr == tempStackArrayBase",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                      ,0x571,
                      "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                     );
      }
      if (pEVar9->funcPtrWrap != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
        (*pEVar9->funcPtrWrap)(pEVar9->funcPtrWrapTarget,(char *)paVar14,(char *)paVar14);
        if (this->callContinue != true) {
          return false;
        }
        FastVector<RegVmCmd_*,_false,_false>::pop_back(this_00);
        if (RVar7 == rvrInt) {
          regFilePtr[bVar2].field_0.intValue = paVar14->intValue;
        }
        else if (RVar7 == rvrLong) {
          regFilePtr[bVar2].field_0 = *paVar14;
        }
        else if (RVar7 == rvrDouble) {
          regFilePtr[bVar2].field_0 = *paVar14;
        }
LAB_0013d53b:
        do {
          puVar13 = puVar13 + 3;
          do {
            puVar12 = puVar13;
            uVar6 = puVar12[-3];
            if (uVar6 == 7) {
              return true;
            }
            puVar13 = puVar12 + 1;
            if (uVar6 == 10) {
              uVar6 = *puVar12;
              memcpy((void *)((ulong)puVar12[-1] + regFilePtr[puVar12[-2]].field_0.longValue),
                     paVar14,(ulong)uVar6);
              paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                        ((long)paVar14 + (ulong)(uVar6 & 0xfffffffc));
              goto LAB_0013d53b;
            }
            if (uVar6 == 9) {
              puVar13 = puVar12 + -1;
              regFilePtr[puVar12[-2]].field_0 = *paVar14;
              paVar14 = paVar14 + 1;
              goto LAB_0013d53b;
            }
          } while (uVar6 != 8);
          puVar13 = puVar12 + -1;
          regFilePtr[puVar12[-2]].field_0.intValue = paVar14->intValue;
          paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)((long)paVar14 + 4);
        } while( true );
      }
      error = "ERROR: external raw function calls are disabled";
    }
    else {
      FastVector<RegVmCmd_*,_false,_false>::push_back(this_00,&local_38);
      uVar3 = (this->dataStack).count;
      if ((uVar3 & 0xf) != 0) {
        __assert_fail("dataStack.size() % 16 == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                      ,0x5b5,
                      "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                     );
      }
      uVar4 = pEVar9->argumentSize;
      uVar11 = pEVar9->stackSize + 0xf & 0xfffffff0;
      if (uVar11 < uVar4) {
        __assert_fail("argumentsSize <= stackSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                      ,0x5b6,
                      "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                     );
      }
      if (uVar11 + uVar3 < (this->dataStack).max) {
        paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                  ((long)paVar14 - (ulong)(uVar4 & 0xfffffffc));
        if (paVar14 != (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase) {
          __assert_fail("tempStackPtr == tempStackArrayBase",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                        ,0x5c2,
                        "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                       );
        }
        memcpy((this->dataStack).data + uVar3,paVar14,(ulong)uVar4);
        regFilePtr_00 = &this->regFileLastTop->field_0;
        iVar5 = pEVar9->regVmRegisters;
        this->regFileLastTop = (RegVmRegister *)(regFilePtr_00 + iVar5);
        if (regFilePtr_00 + iVar5 < &this->regFileArrayEnd->field_0) {
          this_01 = &this->dataStack;
          FastVector<char,_true,_true>::resize(this_01,(this->dataStack).count + uVar11);
          if (uVar11 != uVar4) {
            memset(this_01->data + (ulong)uVar4 + (ulong)uVar3,0,(ulong)(uVar11 - uVar4));
          }
          *regFilePtr_00 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
          regFilePtr_00[1].longValue = (int64_t)((this->dataStack).data + uVar3);
          regFilePtr_00[2] =
               (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data;
          regFilePtr_00[3].longValue = (int64_t)regFilePtr_00;
          memset(regFilePtr_00 + 4,0,(long)this->regFileLastTop + (-0x20 - (long)regFilePtr_00));
          RVar8 = RunCode(this->codeBase + uVar6,(RegVmRegister *)regFilePtr_00,this,this->codeBase)
          ;
          if (RVar8 == rvrError) {
            return false;
          }
          if (RVar8 != RVar7) {
            __assert_fail("execResultType == resultType",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                          ,0x5e3,
                          "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                         );
          }
          this->regFileLastTop = (RegVmRegister *)regFilePtr_00;
          FastVector<char,_true,_true>::shrink(this_01,uVar3);
          if (RVar7 == rvrInt) {
            regFilePtr[bVar2].field_0.intValue = paVar14->intValue;
          }
          else if ((RVar7 == rvrLong) || (RVar7 == rvrDouble)) {
            regFilePtr[bVar2].field_0 = *paVar14;
          }
LAB_0013d5bf:
          do {
            puVar13 = puVar13 + 3;
            do {
              puVar12 = puVar13;
              uVar6 = puVar12[-3];
              if (uVar6 == 7) {
                return true;
              }
              puVar13 = puVar12 + 1;
              if (uVar6 == 10) {
                uVar6 = *puVar12;
                memcpy((void *)((ulong)puVar12[-1] + regFilePtr[puVar12[-2]].field_0.longValue),
                       paVar14,(ulong)uVar6);
                paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                          ((long)paVar14 + (ulong)(uVar6 & 0xfffffffc));
                goto LAB_0013d5bf;
              }
              if (uVar6 == 9) {
                puVar13 = puVar12 + -1;
                regFilePtr[puVar12[-2]].field_0 = *paVar14;
                paVar14 = paVar14 + 1;
                goto LAB_0013d5bf;
              }
            } while (uVar6 != 8);
            puVar13 = puVar12 + -1;
            regFilePtr[puVar12[-2]].field_0.intValue = paVar14->intValue;
            paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)((long)paVar14 + 4);
          } while( true );
        }
        error = "ERROR: register overflow";
      }
      else {
        error = "ERROR: stack overflow";
      }
    }
    Stop(this,error);
    return false;
  case 2:
    uVar6 = regFilePtr[puVar12[-1]].field_0.intValue;
    break;
  case 3:
    aVar10 = regFilePtr[puVar12[-1]].field_0;
    goto LAB_0013d246;
  case 4:
    uVar6 = puVar12[-1];
    break;
  case 5:
    aVar10.longValue._4_4_ = 0;
    aVar10.intValue = puVar12[-1];
LAB_0013d246:
    *paVar14 = aVar10;
    paVar14 = paVar14 + 1;
    goto LAB_0013d203;
  case 6:
    goto switchD_0013d21c_caseD_6;
  default:
    goto switchD_0013d21c_default;
  }
  paVar14->intValue = uVar6;
  paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)((long)paVar14 + 4);
  goto LAB_0013d203;
switchD_0013d21c_caseD_6:
  puVar1 = puVar12 + -1;
  uVar6 = *puVar12;
  uVar3 = *puVar13;
  puVar12 = puVar12 + 2;
  memcpy(paVar14,(void *)((ulong)uVar6 + regFilePtr[*puVar1].field_0.longValue),(ulong)uVar3);
  paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
            ((long)paVar14 + (ulong)(uVar3 & 0xfffffffc));
  goto LAB_0013d203;
}

Assistant:

bool ExecutorRegVm::ExecCall(unsigned microcodePos, unsigned functionId, RegVmCmd * const instruction, RegVmRegister * const regFilePtr)
{
	unsigned *tempStackPtr = tempStackArrayBase;

	ExternFuncInfo &target = exFunctions[functionId];

	// Push arguments
	unsigned *microcode = exLinker->exRegVmConstants.data + microcodePos;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			*tempStackPtr = regFilePtr[*microcode++].intValue;
			tempStackPtr += 1;
			break;
		case rvmiPushQword:
			memcpy(tempStackPtr, &regFilePtr[*microcode++].longValue, sizeof(long long));
			tempStackPtr += 2;
			break;
		case rvmiPushImm:
			*tempStackPtr = *microcode++;
			tempStackPtr += 1;
			break;
		case rvmiPushImmq:
			vmStoreLong(tempStackPtr, *microcode++);
			tempStackPtr += 2;
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;
			memcpy(tempStackPtr, (char*)regFilePtr[reg].ptrValue + offset, size);
			tempStackPtr += size >> 2;
		}
		break;
		}
	}

	microcode++;

	unsigned char resultReg = *microcode++ & 0xff;
	unsigned char resultType = *microcode++ & 0xff;

	unsigned address = target.regVmAddress;

	if(address == ~0u)
	{
		callStack.push_back(instruction + 1);

		// Take arguments
		tempStackPtr -= target.argumentSize >> 2;

		assert(tempStackPtr == tempStackArrayBase);

		if(target.funcPtrWrap)
		{
			target.funcPtrWrap(target.funcPtrWrapTarget, (char*)tempStackPtr, (char*)tempStackPtr);

			if(!callContinue)
				return false;
		}
		else
		{
			if(!RunExternalFunction(functionId, tempStackPtr))
				return false;
		}

		callStack.pop_back();

		switch(resultType)
		{
		case rvrDouble:
			memcpy(&regFilePtr[resultReg].doubleValue, tempStackPtr, sizeof(double));
			break;
		case rvrLong:
			memcpy(&regFilePtr[resultReg].longValue, tempStackPtr, sizeof(long long));
			break;
		case rvrInt:
			regFilePtr[resultReg].intValue = *tempStackPtr;
			break;
		default:
			break;
		}

		unsigned *curr = tempStackPtr;

		while(*microcode != rvmiReturn)
		{
			switch(*microcode++)
			{
			case rvmiPop:
				regFilePtr[*microcode++].intValue = *curr;
				curr += 1;
				break;
			case rvmiPopq:
				regFilePtr[*microcode++].longValue = vmLoadLong(curr);
				curr += 2;
				break;
			case rvmiPopMem:
			{
				unsigned reg = *microcode++;
				unsigned offset = *microcode++;
				unsigned size = *microcode++;
				memcpy((char*)regFilePtr[reg].ptrValue + offset, curr, size);
				curr += size >> 2;
			}
			break;
			}
		}

		return true;
	}

	callStack.push_back(instruction + 1);

	unsigned prevDataSize = dataStack.size();

	unsigned argumentsSize = target.argumentSize;
	unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

	assert(dataStack.size() % 16 == 0);
	assert(argumentsSize <= stackSize);

	if(dataStack.size() + stackSize >= dataStack.max)
	{
		Stop("ERROR: stack overflow");

		return false;
	}

	// Take arguments
	tempStackPtr -= target.argumentSize >> 2;

	assert(tempStackPtr == tempStackArrayBase);

	// Copy function arguments to new stack frame
	memcpy((char*)(dataStack.data + dataStack.size()), tempStackPtr, argumentsSize);

	RegVmRegister *regFileTop = regFileLastTop;

	regFileLastTop = regFileTop + target.regVmRegisters;

	if(regFileLastTop >= regFileArrayEnd)
	{
		Stop("ERROR: register overflow");

		return false;
	}

	dataStack.resize(dataStack.size() + stackSize);

	if(stackSize - argumentsSize)
		memset(dataStack.data + prevDataSize + argumentsSize, 0, stackSize - argumentsSize);

	regFileTop[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
	regFileTop[rvrrFrame].ptrValue = uintptr_t(dataStack.data + prevDataSize);
	regFileTop[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
	regFileTop[rvrrRegisters].ptrValue = uintptr_t(regFileTop);

	memset(regFileTop + rvrrCount, 0, (regFileLastTop - regFileTop - rvrrCount) * sizeof(regFilePtr[0]));

	RegVmReturnType execResultType = RunCode(codeBase + address, regFileTop, this, codeBase);

	if(execResultType == rvrError)
		return false;

	assert(execResultType == resultType);

	regFileLastTop = regFileTop;

	dataStack.shrink(prevDataSize);

	switch(resultType)
	{
	case rvrDouble:
		memcpy(&regFilePtr[resultReg].doubleValue, tempStackPtr, sizeof(double));
		break;
	case rvrLong:
		memcpy(&regFilePtr[resultReg].longValue, tempStackPtr, sizeof(long long));
		break;
	case rvrInt:
		regFilePtr[resultReg].intValue = *tempStackPtr;
		break;
	default:
		break;
	}

	unsigned *curr = tempStackPtr;

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			regFilePtr[*microcode++].intValue = *curr;
			curr += 1;
			break;
		case rvmiPopq:
			regFilePtr[*microcode++].longValue = vmLoadLong(curr);
			curr += 2;
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;
			memcpy((char*)regFilePtr[reg].ptrValue + offset, curr, size);
			curr += size >> 2;
		}
		break;
		}
	}

	return true;
}